

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::ConvertToRelativePath
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  pointer pcVar1;
  bool bVar2;
  cmStateDirectory cStack_48;
  
  cmStateSnapshot::GetDirectory(&cStack_48,&this->StateSnapshot);
  bVar2 = ContainedInDirectory(param_1,remote_path,&cStack_48);
  if (bVar2) {
    ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (remote_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + remote_path->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToRelativePath(
  std::string const& local_path, std::string const& remote_path) const
{
  if (!ContainedInDirectory(local_path, remote_path,
                            this->StateSnapshot.GetDirectory())) {
    return remote_path;
  }

  return this->ForceToRelativePath(local_path, remote_path);
}